

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void unwindstack(lua_State *L,TValue *top)

{
  lj_func_closeuv(L,top);
  if (top < L->top + -1) {
    *top = L->top[-1];
    L->top = top + 1;
  }
  lj_state_relimitstack(L);
  return;
}

Assistant:

LJ_NOINLINE static void unwindstack(lua_State *L, TValue *top)
{
  lj_func_closeuv(L, top);
  if (top < L->top-1) {
    copyTV(L, top, L->top-1);
    L->top = top+1;
  }
  lj_state_relimitstack(L);
}